

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void OPLWriteReg(FM_OPL *OPL,UINT8 r,UINT8 v)

{
  byte bVar1;
  UINT8 UVar2;
  OPL_CH *CH_00;
  uint uVar3;
  int *local_50;
  UINT8 local_44;
  uint local_28;
  UINT8 block;
  UINT8 st2;
  UINT8 st1;
  int block_fnum;
  int slot;
  OPL_CH *CH;
  UINT8 v_local;
  UINT8 r_local;
  FM_OPL *OPL_local;
  
  bVar1 = r & 0xe0;
  if ((r & 0xe0) == 0) {
    switch(r & 0x1f) {
    case 1:
      if ((OPL->type & 1) != 0) {
        OPL->wavesel = v & 0x20;
      }
      break;
    case 2:
      OPL->T[0] = (0x100 - (uint)v) * 4;
      break;
    case 3:
      OPL->T[1] = (0x100 - (uint)v) * 0x10;
      break;
    case 4:
      if ((v & 0x80) == 0) {
        bVar1 = (byte)((int)(uint)v >> 1) & 1;
        OPL_STATUS_RESET(OPL,v & 0x70);
        OPL_STATUSMASK_SET(OPL,(v ^ 0xffffffff) & 0x78);
        if (OPL->st[1] != bVar1) {
          OPL->st[1] = bVar1;
        }
        if (OPL->st[0] != (v & 1)) {
          OPL->st[0] = v & 1;
        }
      }
      else {
        OPL_STATUS_RESET(OPL,0x77);
      }
      break;
    default:
      emu_logf(&OPL->logger,'\x04',"write to unknown register: %02x\n",(ulong)r);
      break;
    case 6:
      if ((OPL->type & 4) != 0) {
        if (OPL->keyboardhandler_w == (OPL_PORTHANDLER_W)0x0) {
          emu_logf(&OPL->logger,'\x04',"write unmapped KEYBOARD port\n");
        }
        else {
          (*OPL->keyboardhandler_w)(OPL->keyboard_param,v);
        }
      }
      break;
    case 7:
      if ((OPL->type & 2) != 0) {
        YM_DELTAT_ADPCM_Write(OPL->deltat,r - 7,(uint)v);
      }
      break;
    case 8:
      OPL->mode = v;
      if ((OPL->type & 2) != 0) {
        YM_DELTAT_ADPCM_Write(OPL->deltat,r - 7,v & 0xf);
      }
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
      if ((OPL->type & 2) != 0) {
        YM_DELTAT_ADPCM_Write(OPL->deltat,r - 7,(uint)v);
      }
      break;
    case 0x15:
    case 0x16:
    case 0x17:
      emu_logf(&OPL->logger,'\x04',
               "DAC data register written, but not implemented reg=%02x val=%02x\n",(ulong)r,
               (ulong)v);
      break;
    case 0x18:
      if ((OPL->type & 8) != 0) {
        OPL->portDirection = v & 0xf;
      }
      break;
    case 0x19:
      if (((OPL->type & 8) != 0) &&
         (OPL->portLatch = v, OPL->porthandler_w != (OPL_PORTHANDLER_W)0x0)) {
        (*OPL->porthandler_w)(OPL->port_param,v & OPL->portDirection);
      }
    }
  }
  else if (bVar1 == 0x20) {
    if (-1 < slot_array[(int)(r & 0x1f)]) {
      set_mul(OPL,slot_array[(int)(r & 0x1f)],(uint)v);
    }
  }
  else if (bVar1 == 0x40) {
    if (-1 < slot_array[(int)(r & 0x1f)]) {
      set_ksl_tl(OPL,slot_array[(int)(r & 0x1f)],(uint)v);
    }
  }
  else if (bVar1 == 0x60) {
    if (-1 < slot_array[(int)(r & 0x1f)]) {
      set_ar_dr(OPL,slot_array[(int)(r & 0x1f)],(uint)v);
    }
  }
  else if (bVar1 == 0x80) {
    if (-1 < slot_array[(int)(r & 0x1f)]) {
      set_sl_rr(OPL,slot_array[(int)(r & 0x1f)],(uint)v);
    }
  }
  else if (bVar1 == 0xa0) {
    if (r == 0xbd) {
      OPL->lfo_am_depth = v & 0x80;
      UVar2 = '\0';
      if ((v & 0x40) != 0) {
        UVar2 = '\b';
      }
      OPL->lfo_pm_depth_range = UVar2;
      OPL->rhythm = v & 0x3f;
      if ((OPL->rhythm & 0x20) == 0) {
        FM_KEYOFF(OPL->P_CH[6].SLOT,0xfffffffd);
        FM_KEYOFF(OPL->P_CH[6].SLOT + 1,0xfffffffd);
        FM_KEYOFF(OPL->P_CH[7].SLOT,0xfffffffd);
        FM_KEYOFF(OPL->P_CH[7].SLOT + 1,0xfffffffd);
        FM_KEYOFF(OPL->P_CH[8].SLOT,0xfffffffd);
        FM_KEYOFF(OPL->P_CH[8].SLOT + 1,0xfffffffd);
      }
      else {
        if ((v & 0x10) == 0) {
          FM_KEYOFF(OPL->P_CH[6].SLOT,0xfffffffd);
          FM_KEYOFF(OPL->P_CH[6].SLOT + 1,0xfffffffd);
        }
        else {
          FM_KEYON(OPL->P_CH[6].SLOT,2);
          FM_KEYON(OPL->P_CH[6].SLOT + 1,2);
        }
        if ((v & 1) == 0) {
          FM_KEYOFF(OPL->P_CH[7].SLOT,0xfffffffd);
        }
        else {
          FM_KEYON(OPL->P_CH[7].SLOT,2);
        }
        if ((v & 8) == 0) {
          FM_KEYOFF(OPL->P_CH[7].SLOT + 1,0xfffffffd);
        }
        else {
          FM_KEYON(OPL->P_CH[7].SLOT + 1,2);
        }
        if ((v & 4) == 0) {
          FM_KEYOFF(OPL->P_CH[8].SLOT,0xfffffffd);
        }
        else {
          FM_KEYON(OPL->P_CH[8].SLOT,2);
        }
        if ((v & 2) == 0) {
          FM_KEYOFF(OPL->P_CH[8].SLOT + 1,0xfffffffd);
        }
        else {
          FM_KEYON(OPL->P_CH[8].SLOT + 1,2);
        }
      }
    }
    else if ((r & 0xf) < 9) {
      CH_00 = OPL->P_CH + (int)(r & 0xf);
      if ((r & 0x10) == 0) {
        local_28 = CH_00->block_fnum & 0x1f00 | (uint)v;
      }
      else {
        local_28 = (v & 0x1f) << 8 | CH_00->block_fnum & 0xff;
        if ((v & 0x20) == 0) {
          FM_KEYOFF(CH_00->SLOT,0xfffffffe);
          FM_KEYOFF(CH_00->SLOT + 1,0xfffffffe);
        }
        else {
          FM_KEYON(CH_00->SLOT,1);
          FM_KEYON(CH_00->SLOT + 1,1);
        }
      }
      if (CH_00->block_fnum != local_28) {
        CH_00->block_fnum = local_28;
        CH_00->ksl_base = ksl_tab[(int)local_28 >> 6];
        CH_00->fc = OPL->fn_tab[(int)(local_28 & 0x3ff)] >>
                    (7U - (char)((int)local_28 >> 10) & 0x1f);
        CH_00->kcode = (UINT8)((CH_00->block_fnum & 0x1c00) >> 9);
        if ((OPL->mode & 0x40) == 0) {
          CH_00->kcode = CH_00->kcode | (byte)((CH_00->block_fnum & 0x200) >> 9);
        }
        else {
          CH_00->kcode = CH_00->kcode | (byte)(CH_00->block_fnum >> 8) & 1;
        }
        CH_00->SLOT[0].TLL = CH_00->SLOT[0].TL + (CH_00->ksl_base >> (CH_00->SLOT[0].ksl & 0x1f));
        CH_00->SLOT[1].TLL = CH_00->SLOT[1].TL + (CH_00->ksl_base >> (CH_00->SLOT[1].ksl & 0x1f));
        CALC_FCSLOT(CH_00,CH_00->SLOT);
        CALC_FCSLOT(CH_00,CH_00->SLOT + 1);
      }
    }
  }
  else if (bVar1 == 0xc0) {
    if ((r & 0xf) < 9) {
      uVar3 = r & 0xf;
      if (((int)(uint)v >> 1 & 7U) == 0) {
        local_44 = '\0';
      }
      else {
        local_44 = ((byte)((int)(uint)v >> 1) & 7) + 7;
      }
      OPL->P_CH[(int)uVar3].SLOT[0].FB = local_44;
      OPL->P_CH[(int)uVar3].SLOT[0].CON = v & 1;
      if (OPL->P_CH[(int)uVar3].SLOT[0].CON == '\0') {
        local_50 = &OPL->phase_modulation;
      }
      else {
        local_50 = OPL->output;
      }
      OPL->P_CH[(int)uVar3].SLOT[0].connect1 = local_50;
    }
  }
  else if (((bVar1 == 0xe0) && (OPL->wavesel != '\0')) &&
          (uVar3 = slot_array[(int)(r & 0x1f)], -1 < (int)uVar3)) {
    OPL->P_CH[(int)uVar3 / 2].SLOT[(int)(uVar3 & 1)].wavetable = (v & 3) << 10;
  }
  return;
}

Assistant:

static void OPLWriteReg(FM_OPL *OPL, UINT8 r, UINT8 v)
{
	OPL_CH *CH;
	int slot;
	int block_fnum;


	/* adjust bus to 8 bits */
	//r &= 0xff;
	//v &= 0xff;

	switch(r&0xe0)
	{
	case 0x00:  /* 00-1f:control */
		switch(r&0x1f)
		{
		case 0x01:  /* waveform select enable */
			if(OPL->type&OPL_TYPE_WAVESEL)
			{
				OPL->wavesel = v&0x20;
				/* do not change the waveform previously selected */
			}
			break;
		case 0x02:  /* Timer 1 */
			OPL->T[0] = (256-v)*4;
			break;
		case 0x03:  /* Timer 2 */
			OPL->T[1] = (256-v)*16;
			break;
		case 0x04:  /* IRQ clear / mask and Timer enable */
			if(v&0x80)
			{   /* IRQ flag clear */
				OPL_STATUS_RESET(OPL,0x7f-0x08); /* don't reset BFRDY flag or we will have to call deltat module to set the flag */
			}
			else
			{   /* set IRQ mask ,timer enable*/
				UINT8 st1 = v&1;
				UINT8 st2 = (v>>1)&1;

				/* IRQRST,T1MSK,t2MSK,EOSMSK,BRMSK,x,ST2,ST1 */
				OPL_STATUS_RESET(OPL, v & (0x78-0x08) );
				OPL_STATUSMASK_SET(OPL, (~v) & 0x78 );

				/* timer 2 */
				if(OPL->st[1] != st2)
				{
					//attotime period = st2 ? attotime_mul(OPL->TimerBase, OPL->T[1]) : attotime_zero;
					OPL->st[1] = st2;
					//if (OPL->timer_handler) (OPL->timer_handler)(OPL->TimerParam,1,period);
				}
				/* timer 1 */
				if(OPL->st[0] != st1)
				{
					//attotime period = st1 ? attotime_mul(OPL->TimerBase, OPL->T[0]) : attotime_zero;
					OPL->st[0] = st1;
					//if (OPL->timer_handler) (OPL->timer_handler)(OPL->TimerParam,0,period);
				}
			}
			break;
#if BUILD_Y8950
		case 0x06:      /* Key Board OUT */
			if(OPL->type&OPL_TYPE_KEYBOARD)
			{
				if(OPL->keyboardhandler_w)
					OPL->keyboardhandler_w(OPL->keyboard_param,v);
				else
					emu_logf(&OPL->logger, DEVLOG_DEBUG, "write unmapped KEYBOARD port\n");
			}
			break;
		case 0x07:  /* DELTA-T control 1 : START,REC,MEMDATA,REPT,SPOFF,x,x,RST */
			if(OPL->type&OPL_TYPE_ADPCM)
				YM_DELTAT_ADPCM_Write(OPL->deltat,r-0x07,v);
			break;
#endif
		case 0x08:  /* MODE,DELTA-T control 2 : CSM,NOTESEL,x,x,smpl,da/ad,64k,rom */
			OPL->mode = v;
#if BUILD_Y8950
			if(OPL->type&OPL_TYPE_ADPCM)
				YM_DELTAT_ADPCM_Write(OPL->deltat,r-0x07,v&0x0f); /* mask 4 LSBs in register 08 for DELTA-T unit */
#endif
			break;

#if BUILD_Y8950
		case 0x09:      /* START ADD */
		case 0x0a:
		case 0x0b:      /* STOP ADD  */
		case 0x0c:
		case 0x0d:      /* PRESCALE   */
		case 0x0e:
		case 0x0f:      /* ADPCM data write */
		case 0x10:      /* DELTA-N    */
		case 0x11:      /* DELTA-N    */
		case 0x12:      /* ADPCM volume */
			if(OPL->type&OPL_TYPE_ADPCM)
				YM_DELTAT_ADPCM_Write(OPL->deltat,r-0x07,v);
			break;

		case 0x15:      /* DAC data high 8 bits (F7,F6...F2) */
		case 0x16:      /* DAC data low 2 bits (F1, F0 in bits 7,6) */
		case 0x17:      /* DAC data shift (S2,S1,S0 in bits 2,1,0) */
			emu_logf(&OPL->logger, DEVLOG_DEBUG, "DAC data register written, but not implemented reg=%02x val=%02x\n",r,v);
			break;

		case 0x18:      /* I/O CTRL (Direction) */
			if(OPL->type&OPL_TYPE_IO)
				OPL->portDirection = v&0x0f;
			break;
		case 0x19:      /* I/O DATA */
			if(OPL->type&OPL_TYPE_IO)
			{
				OPL->portLatch = v;
				if(OPL->porthandler_w)
					OPL->porthandler_w(OPL->port_param,v&OPL->portDirection);
			}
			break;
#endif
		default:
			emu_logf(&OPL->logger, DEVLOG_DEBUG, "write to unknown register: %02x\n",r);
			break;
		}
		break;
	case 0x20:  /* am ON, vib ON, ksr, eg_type, mul */
		slot = slot_array[r&0x1f];
		if(slot < 0) return;
		set_mul(OPL,slot,v);
		break;
	case 0x40:
		slot = slot_array[r&0x1f];
		if(slot < 0) return;
		set_ksl_tl(OPL,slot,v);
		break;
	case 0x60:
		slot = slot_array[r&0x1f];
		if(slot < 0) return;
		set_ar_dr(OPL,slot,v);
		break;
	case 0x80:
		slot = slot_array[r&0x1f];
		if(slot < 0) return;
		set_sl_rr(OPL,slot,v);
		break;
	case 0xa0:
		if (r == 0xbd)          /* am depth, vibrato depth, r,bd,sd,tom,tc,hh */
		{
			OPL->lfo_am_depth = v & 0x80;
			OPL->lfo_pm_depth_range = (v&0x40) ? 8 : 0;

			OPL->rhythm  = v&0x3f;

			if(OPL->rhythm&0x20)
			{
				/* BD key on/off */
				if(v&0x10)
				{
					FM_KEYON (&OPL->P_CH[6].SLOT[SLOT1], 2);
					FM_KEYON (&OPL->P_CH[6].SLOT[SLOT2], 2);
				}
				else
				{
					FM_KEYOFF(&OPL->P_CH[6].SLOT[SLOT1],~2);
					FM_KEYOFF(&OPL->P_CH[6].SLOT[SLOT2],~2);
				}
				/* HH key on/off */
				if(v&0x01) FM_KEYON (&OPL->P_CH[7].SLOT[SLOT1], 2);
				else       FM_KEYOFF(&OPL->P_CH[7].SLOT[SLOT1],~2);
				/* SD key on/off */
				if(v&0x08) FM_KEYON (&OPL->P_CH[7].SLOT[SLOT2], 2);
				else       FM_KEYOFF(&OPL->P_CH[7].SLOT[SLOT2],~2);
				/* TOM key on/off */
				if(v&0x04) FM_KEYON (&OPL->P_CH[8].SLOT[SLOT1], 2);
				else       FM_KEYOFF(&OPL->P_CH[8].SLOT[SLOT1],~2);
				/* TOP-CY key on/off */
				if(v&0x02) FM_KEYON (&OPL->P_CH[8].SLOT[SLOT2], 2);
				else       FM_KEYOFF(&OPL->P_CH[8].SLOT[SLOT2],~2);
			}
			else
			{
				/* BD key off */
				FM_KEYOFF(&OPL->P_CH[6].SLOT[SLOT1],~2);
				FM_KEYOFF(&OPL->P_CH[6].SLOT[SLOT2],~2);
				/* HH key off */
				FM_KEYOFF(&OPL->P_CH[7].SLOT[SLOT1],~2);
				/* SD key off */
				FM_KEYOFF(&OPL->P_CH[7].SLOT[SLOT2],~2);
				/* TOM key off */
				FM_KEYOFF(&OPL->P_CH[8].SLOT[SLOT1],~2);
				/* TOP-CY off */
				FM_KEYOFF(&OPL->P_CH[8].SLOT[SLOT2],~2);
			}
			return;
		}
		/* keyon,block,fnum */
		if( (r&0x0f) > 8) return;
		CH = &OPL->P_CH[r&0x0f];
		if(!(r&0x10))
		{   /* a0-a8 */
			block_fnum  = (CH->block_fnum&0x1f00) | v;
		}
		else
		{   /* b0-b8 */
			block_fnum = ((v&0x1f)<<8) | (CH->block_fnum&0xff);

			if(v&0x20)
			{
				FM_KEYON (&CH->SLOT[SLOT1], 1);
				FM_KEYON (&CH->SLOT[SLOT2], 1);
			}
			else
			{
				FM_KEYOFF(&CH->SLOT[SLOT1],~1);
				FM_KEYOFF(&CH->SLOT[SLOT2],~1);
			}
		}
		/* update */
		if(CH->block_fnum != block_fnum)
		{
			UINT8 block  = block_fnum >> 10;

			CH->block_fnum = block_fnum;

			CH->ksl_base = ksl_tab[block_fnum>>6];
			CH->fc       = OPL->fn_tab[block_fnum&0x03ff] >> (7-block);

			/* BLK 2,1,0 bits -> bits 3,2,1 of kcode */
			CH->kcode    = (CH->block_fnum&0x1c00)>>9;

			/* the info below is actually opposite to what is stated in the Manuals (verifed on real YM3812) */
			/* if notesel == 0 -> lsb of kcode is bit 10 (MSB) of fnum  */
			/* if notesel == 1 -> lsb of kcode is bit 9 (MSB-1) of fnum */
			if (OPL->mode&0x40)
				CH->kcode |= (CH->block_fnum&0x100)>>8; /* notesel == 1 */
			else
				CH->kcode |= (CH->block_fnum&0x200)>>9; /* notesel == 0 */

			/* refresh Total Level in both SLOTs of this channel */
			CH->SLOT[SLOT1].TLL = CH->SLOT[SLOT1].TL + (CH->ksl_base>>CH->SLOT[SLOT1].ksl);
			CH->SLOT[SLOT2].TLL = CH->SLOT[SLOT2].TL + (CH->ksl_base>>CH->SLOT[SLOT2].ksl);

			/* refresh frequency counter in both SLOTs of this channel */
			CALC_FCSLOT(CH,&CH->SLOT[SLOT1]);
			CALC_FCSLOT(CH,&CH->SLOT[SLOT2]);
		}
		break;
	case 0xc0:
		/* FB,C */
		if( (r&0x0f) > 8) return;
		CH = &OPL->P_CH[r&0x0f];
		CH->SLOT[SLOT1].FB  = (v>>1)&7 ? ((v>>1)&7) + 7 : 0;
		CH->SLOT[SLOT1].CON = v&1;
		CH->SLOT[SLOT1].connect1 = CH->SLOT[SLOT1].CON ? &OPL->output[0] : &OPL->phase_modulation;
		break;
	case 0xe0: /* waveform select */
		/* simply ignore write to the waveform select register if selecting not enabled in test register */
		if(OPL->wavesel)
		{
			slot = slot_array[r&0x1f];
			if(slot < 0) return;
			CH = &OPL->P_CH[slot/2];

			CH->SLOT[slot&1].wavetable = (v&0x03)*SIN_LEN;
		}
		break;
	}
}